

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall
cmGraphVizWriter::cmGraphVizWriter
          (cmGraphVizWriter *this,string *fileName,cmGlobalGenerator *globalGenerator)

{
  cmGlobalGenerator *this_00;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  cmGlobalGenerator *local_20;
  cmGlobalGenerator *globalGenerator_local;
  string *fileName_local;
  cmGraphVizWriter *this_local;
  
  local_20 = globalGenerator;
  globalGenerator_local = (cmGlobalGenerator *)fileName;
  fileName_local = (string *)this;
  cmLinkItemGraphVisitor::cmLinkItemGraphVisitor(&this->super_cmLinkItemGraphVisitor);
  (this->super_cmLinkItemGraphVisitor)._vptr_cmLinkItemGraphVisitor =
       (_func_int **)&PTR__cmGraphVizWriter_011c7818;
  std::__cxx11::string::string((string *)&this->FileName,(string *)globalGenerator_local);
  cmGeneratedFileStream::cmGeneratedFileStream
            (&this->GlobalFileStream,(string *)globalGenerator_local,false,None);
  std::
  map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
  ::map(&this->PerTargetConnections);
  std::
  map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
  ::map(&this->TargetDependersConnections);
  this_00 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_PROJECT_NAME",&local_51);
  cmGlobalGenerator::GetSafeGlobalSetting(&this->GraphName,this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->GraphHeader,"node [\n  fontsize = \"12\"\n];",&local_52);
  std::allocator<char>::~allocator(&local_52);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->GraphNodePrefix,"node",&local_53);
  std::allocator<char>::~allocator(&local_53);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            (&this->TargetsToIgnoreRegex);
  this->GlobalGenerator = local_20;
  this->NextNodeId = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->NodeNames);
  this->GenerateForExecutables = true;
  this->GenerateForStaticLibs = true;
  this->GenerateForSharedLibs = true;
  this->GenerateForModuleLibs = true;
  this->GenerateForInterfaceLibs = true;
  this->GenerateForObjectLibs = true;
  this->GenerateForUnknownLibs = true;
  this->GenerateForCustomTargets = false;
  this->GenerateForExternals = true;
  this->GeneratePerTarget = true;
  this->GenerateDependers = true;
  return;
}

Assistant:

cmGraphVizWriter::cmGraphVizWriter(std::string const& fileName,
                                   const cmGlobalGenerator* globalGenerator)
  : FileName(fileName)
  , GlobalFileStream(fileName)
  , GraphName(globalGenerator->GetSafeGlobalSetting("CMAKE_PROJECT_NAME"))
  , GraphHeader("node [\n  fontsize = \"12\"\n];")
  , GraphNodePrefix("node")
  , GlobalGenerator(globalGenerator)
{
}